

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
diligent_spirv_cross::CompilerGLSL::enclose_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,string *expr)

{
  bool bVar1;
  undefined8 in_RAX;
  char *in_R8;
  undefined1 auStack_18 [7];
  diligent_spirv_cross local_11;
  
  _auStack_18 = in_RAX;
  bVar1 = needs_enclose_expression(expr);
  if (bVar1) {
    _auStack_18 = CONCAT17(0x28,CONCAT16(0x29,auStack_18._0_6_));
    join<char,std::__cxx11::string_const&,char>
              (__return_storage_ptr__,(diligent_spirv_cross *)(auStack_18 + 7),(char *)expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(auStack_18 + 6)
               ,in_R8);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)expr);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::enclose_expression(const string &expr)
{
	// If this expression contains any spaces which are not enclosed by parentheses,
	// we need to enclose it so we can treat the whole string as an expression.
	// This happens when two expressions have been part of a binary op earlier.
	if (needs_enclose_expression(expr))
		return join('(', expr, ')');
	else
		return expr;
}